

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)2>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  _Bit_type *p_Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  size_type sVar17;
  double *pdVar18;
  pointer pdVar19;
  int iVar20;
  size_t sVar21;
  long lVar22;
  uint uVar23;
  double *pdVar24;
  ulong uVar25;
  uint uVar26;
  size_type __n;
  _Bit_type *__first_p;
  ulong *puVar27;
  double dVar28;
  vector<bool,_std::allocator<bool>_> used;
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  vector<int,_std::allocator<int>_> levels;
  SplitDirections split;
  Data2D<int> dagUp;
  uint local_23c;
  double *local_228;
  allocator_type local_201;
  double *local_200;
  long local_1f8;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  vector<bool,_std::allocator<bool>_> local_1e0;
  pointer local_1b8;
  Data2D<int> *local_1b0;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  vector<double,_std::allocator<double>_> local_190;
  vector<int,_std::allocator<int>_> local_178;
  vector<int,_std::allocator<int>_> local_158;
  pointer local_140;
  long local_138;
  vector<int,_std::allocator<int>_> local_130;
  vector<double,_std::allocator<double>_> local_118;
  vector<int,_std::allocator<int>_> local_100;
  SplitDirections local_e8;
  long local_b0;
  pointer local_a8;
  long local_a0;
  long local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  Data2D<int> local_58;
  
  iVar8 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar8;
  sVar21 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_58.stride = CONCAT44(local_58.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_200 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_e8.job_directions,sVar21 * __n,(value_type_conflict3 *)&local_58,
             (allocator_type *)&local_1e0);
  pdVar24 = (double *)
            local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar21;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    getNormalization(&local_118,this);
    local_1e8 = 1;
    if (output == -1) {
      local_1e8 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_1f8 = (long)(int)local_1e8;
    local_1b8 = (pointer)0x0;
    local_228 = (double *)0x0;
    if (local_200 == (double *)0x0) {
      local_58.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_e8,local_1f8 * __n,
                 (value_type_conflict2 *)&local_58,(allocator_type *)&local_1e0);
      local_1b8 = local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_228 = (double *)
                  local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_200 = (double *)
                  local_e8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_1b0 = __return_storage_ptr__;
    if (criteria < refine_direction_selective) {
      if (0 < iVar8) {
        sVar3 = (this->surpluses).stride;
        pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar17 = 0;
        pdVar18 = local_200;
        pdVar19 = pdVar4;
        do {
          if (output == -1) {
            lVar15 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar15) {
              bVar11 = true;
              lVar12 = 0;
              do {
                if (bVar11) {
                  bVar11 = (ABS(pdVar19[lVar12]) * pdVar18[lVar12]) /
                           local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar12] <= tolerance;
                }
                else {
                  bVar11 = false;
                }
                lVar12 = lVar12 + 1;
              } while (lVar15 != lVar12);
              goto LAB_001a2b18;
            }
          }
          else {
            bVar11 = (ABS(pdVar4[sVar3 * sVar17 + (long)output]) * local_200[sVar17 * local_1f8]) /
                     local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output] <= tolerance;
LAB_001a2b18:
            if ((!bVar11) &&
               (lVar15 = (long)(this->super_BaseCanonicalGrid).num_dimensions, 0 < lVar15)) {
              lVar12 = 0;
              do {
                *(undefined4 *)((long)pdVar24 + lVar12) = 1;
                lVar12 = lVar12 + 4;
              } while (lVar15 * 4 != lVar12);
            }
          }
          sVar17 = sVar17 + 1;
          pdVar19 = pdVar19 + sVar3;
          pdVar18 = pdVar18 + local_1f8;
          pdVar24 = (double *)((long)pdVar24 + sVar21 * 4);
        } while (sVar17 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_58,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_e8,mset);
      iVar8 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_e8);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_130,__n,(allocator_type *)&local_1e0);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_100,(long)iVar8,(allocator_type *)&local_1e0);
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize(&local_158,(long)this->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_178,(long)this->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_1e0,(long)iVar8,false);
      if (0 < (int)((ulong)((long)local_e8.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_e8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_98 = (long)output;
        local_90 = __return_storage_ptr__->stride;
        local_a8 = (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_68 = (ulong)local_1e8;
        lVar15 = 0;
        local_b0 = local_98 * 8;
        do {
          iVar8 = *(int *)((long)local_e8.job_directions.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar15 * 4);
          piVar5 = local_e8.job_pnts.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar15].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar25 = (ulong)((long)local_e8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar15].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
          local_1a0 = local_1f8;
          uVar23 = (uint)uVar25;
          local_198 = (long)(int)uVar23;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_190,local_198 * local_1f8,&local_201);
          local_a0 = lVar15;
          if (output == -1) {
            if ((int)uVar23 < 1) goto LAB_001a2eb5;
            uVar13 = 0;
            local_23c = 0;
            do {
              lVar15 = (long)(this->super_BaseCanonicalGrid).num_outputs;
              if (0 < lVar15) {
                memmove(local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + local_1a0 * uVar13,
                        (this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)piVar5[uVar13] * (this->super_BaseCanonicalGrid).values.num_outputs,
                        lVar15 << 3);
              }
              local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar5[uVar13]] = (int)uVar13;
              uVar10 = (this->super_BaseCanonicalGrid).points.indexes.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)piVar5[uVar13] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + (long)iVar8
                                ];
              uVar26 = uVar10;
              if ((1 < uVar10) && (uVar26 = 1, uVar10 != 2)) {
                uVar10 = uVar10 - 1;
                do {
                  uVar10 = (int)uVar10 >> 1;
                  uVar26 = uVar26 + 1;
                } while (1 < uVar10);
              }
              local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] = uVar26;
              if ((int)local_23c <= (int)uVar26) {
                local_23c = uVar26;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (uVar23 & 0x7fffffff));
          }
          else if ((int)uVar23 < 1) {
LAB_001a2eb5:
            local_23c = 0;
          }
          else {
            sVar21 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            sVar3 = (this->super_BaseCanonicalGrid).values.num_outputs;
            pdVar4 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar13 = 0;
            local_23c = 0;
            do {
              iVar20 = piVar5[uVar13];
              local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_1a0 * uVar13] =
                   *(double *)((long)pdVar4 + sVar3 * (long)iVar20 * 8 + local_b0);
              local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar20] = (int)uVar13;
              uVar10 = piVar6[(long)iVar8 + (long)piVar5[uVar13] * sVar21];
              uVar26 = uVar10;
              if ((1 < uVar10) && (uVar26 = 1, uVar10 != 2)) {
                uVar10 = uVar10 - 1;
                do {
                  uVar10 = (int)uVar10 >> 1;
                  uVar26 = uVar26 + 1;
                } while (1 < uVar10);
              }
              local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] = uVar26;
              if ((int)local_23c <= (int)uVar26) {
                local_23c = uVar26;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (uVar23 & 0x7fffffff));
          }
          local_140 = piVar5;
          if (0 < (int)local_23c) {
            local_1e4 = iVar8 * 2;
            uVar10 = uVar23 & 0x7fffffff;
            local_80 = (ulong)(uVar10 >> 6);
            local_1ec = uVar23 & 0x3f;
            local_78 = (ulong)((uVar10 >> 6) << 3);
            iVar20 = iVar8 * 2 + 2;
            local_70 = ~(0xffffffffffffffffU >> (-(char)local_1ec & 0x3fU));
            local_1a8 = 1;
            local_88 = uVar25;
            do {
              if (0 < (int)local_88) {
                local_138 = 0;
                uVar25 = 0;
                do {
                  piVar5 = local_140;
                  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar25] == (int)local_1a8) {
                    local_60 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>
                                         ((this->super_BaseCanonicalGrid).points.indexes.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start
                                          [(long)local_140[uVar25] *
                                           (this->super_BaseCanonicalGrid).points.num_dimensions +
                                           (long)iVar8]);
                    pdVar4 = local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar15 = local_1a0;
                    p_Var7 = local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    *local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start = local_1e4;
                    *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start = piVar5[uVar25];
                    if (uVar10 < 0x40) {
                      puVar27 = local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                      if (local_1ec != 0) {
LAB_001a300e:
                        *puVar27 = *puVar27 & local_70;
                      }
                    }
                    else {
                      memset(local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                             local_78);
                      if (local_1ec != 0) {
                        puVar27 = p_Var7 + local_80;
                        goto LAB_001a300e;
                      }
                    }
                    if (*local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start < iVar20) {
                      lVar15 = lVar15 * local_138;
                      iVar9 = 0;
                      do {
                        iVar1 = local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar9];
                        if (iVar1 < iVar20) {
                          iVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start
                                  [(long)local_178.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[iVar9] *
                                   local_58.stride + (long)iVar1];
                          lVar12 = (long)iVar2;
                          if (lVar12 != -1) {
                            uVar16 = (ulong)local_130.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[lVar12];
                            uVar13 = uVar16 + 0x3f;
                            if (-1 < (long)uVar16) {
                              uVar13 = uVar16;
                            }
                            if ((local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [((long)uVar13 >> 6) +
                                  ((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                 >> (uVar16 & 0x3f) & 1) == 0) {
                              dVar28 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)2>
                                                 (this->order,
                                                  (this->super_BaseCanonicalGrid).points.indexes.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [(this->super_BaseCanonicalGrid).points.
                                                   num_dimensions * lVar12 + (long)iVar8],local_60);
                              iVar1 = local_130.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar12];
                              uVar13 = (ulong)iVar1;
                              if (0 < (int)local_1e8) {
                                uVar16 = 0;
                                do {
                                  *(double *)((long)pdVar4 + uVar16 * 8 + lVar15) =
                                       local_190.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [local_1a0 * uVar13 + uVar16] * -dVar28 +
                                       *(double *)((long)pdVar4 + uVar16 * 8 + lVar15);
                                  uVar16 = uVar16 + 1;
                                } while (local_68 != uVar16);
                              }
                              uVar16 = uVar13 + 0x3f;
                              if (-1 < (long)uVar13) {
                                uVar16 = uVar13;
                              }
                              local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [((long)uVar16 >> 6) +
                               ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                                   local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [((long)uVar16 >> 6) +
                                    ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )] | 1L << ((byte)iVar1 & 0x3f);
                              local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)iVar9 + 1] = local_1e4;
                              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)iVar9 + 1] = iVar2;
                              iVar9 = iVar9 + 1;
                              goto LAB_001a30cd;
                            }
                          }
                          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar9] = iVar1 + 1;
                        }
                        else {
                          local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar9 + -1] =
                               local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)iVar9 + -1] + 1;
                          iVar9 = iVar9 + -1;
                        }
LAB_001a30cd:
                      } while (*local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start < iVar20);
                    }
                  }
                  uVar25 = uVar25 + 1;
                  local_138 = local_138 + 8;
                } while (uVar25 != uVar10);
              }
              uVar23 = (uint)local_1a8;
              local_1a8 = (ulong)(uVar23 + 1);
              uVar25 = local_88;
            } while (uVar23 != local_23c);
          }
          if (0 < (int)(uint)uVar25) {
            sVar21 = (this->surpluses).stride;
            pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = 0;
            pdVar19 = local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              lVar12 = (long)local_140[uVar13];
              lVar15 = sVar21 * lVar12;
              if (output == -1) {
                lVar22 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                bVar11 = true;
                if (0 < lVar22) {
                  lVar14 = 0;
                  do {
                    if (bVar11 == false) {
                      bVar11 = false;
                    }
                    else {
                      dVar28 = (local_200 + lVar12 * local_1f8)[lVar14];
                      bVar11 = true;
                      if (tolerance <
                          (ABS(pdVar4[lVar15 + lVar14]) * dVar28) /
                          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar14]) {
                        bVar11 = (dVar28 * ABS(pdVar19[lVar14])) /
                                 local_118.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar14] <= tolerance;
                      }
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar22 != lVar14);
                }
              }
              else {
                dVar28 = local_200[lVar12 * local_1f8];
                bVar11 = true;
                if (tolerance <
                    (ABS(pdVar4[lVar15 + local_98]) * dVar28) /
                    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_98]) {
                  bVar11 = (dVar28 * ABS(local_190.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_1a0 * uVar13])) /
                           local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_98] <= tolerance;
                }
              }
              local_a8[(long)iVar8 + lVar12 * local_90] = (uint)(bVar11 ^ 1);
              uVar13 = uVar13 + 1;
              pdVar19 = pdVar19 + local_1a0;
            } while (uVar13 != ((uint)uVar25 & 0x7fffffff));
          }
          if (local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_190.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_190.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar15 = local_a0 + 1;
        } while (lVar15 < (int)((ulong)((long)local_e8.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_e8.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
        operator_delete(local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (ulong *)0x0;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_e8);
      if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_228 != (double *)0x0) {
      operator_delete(local_228,(long)local_1b8 - (long)local_228);
    }
    __return_storage_ptr__ = local_1b0;
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}